

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O2

string * __thiscall
Test::Formats::to_string_abi_cxx11_(string *__return_storage_ptr__,Formats *this,char *val)

{
  char *__rhs;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_38,"\'",&local_59);
  __rhs = "(null)";
  if (this != (Formats *)0x0) {
    __rhs = (char *)this;
  }
  std::operator+(&local_58,&local_38,__rhs);
  std::operator+(__return_storage_ptr__,&local_58,"\'");
  std::__cxx11::string::~string(&local_58);
  std::__cxx11::string::~string(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Formats::to_string(const char *val) { return std::string{"'"} + (val ? val : "(null)") + "'"; }